

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_ego_min(parser *p)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  parser_error pVar4;
  void *pvVar5;
  
  wVar1 = parser_getint(p,"th");
  wVar2 = parser_getint(p,"td");
  wVar3 = parser_getint(p,"ta");
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(wchar_t *)((long)pvVar5 + 0x230) = wVar1;
    *(wchar_t *)((long)pvVar5 + 0x234) = wVar2;
    *(wchar_t *)((long)pvVar5 + 0x238) = wVar3;
    pVar4 = PARSE_ERROR_NONE;
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_ego_min(struct parser *p) {
	int th = parser_getint(p, "th");
	int td = parser_getint(p, "td");
	int ta = parser_getint(p, "ta");
	struct ego_item *e = parser_priv(p);

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	e->min_to_h = th;
	e->min_to_d = td;
	e->min_to_a = ta;
	return PARSE_ERROR_NONE;
}